

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlnode.cpp
# Opt level: O2

XmlNodePtr __thiscall libcellml::XmlNode::next(XmlNode *this)

{
  void *pvVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  undefined8 *in_RSI;
  XmlNodePtr XVar2;
  __shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  pvVar1 = *(void **)(*(long *)*in_RSI + 0x30);
  this->mPimpl = (XmlNodeImpl *)0x0;
  this[1].mPimpl = (XmlNodeImpl *)0x0;
  if (pvVar1 != (void *)0x0) {
    std::make_shared<libcellml::XmlNode>();
    std::__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    this->mPimpl->mXmlNodePtr->_private = pvVar1;
    in_RDX._M_pi = extraout_RDX;
  }
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (XmlNodePtr)XVar2.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

XmlNodePtr XmlNode::next() const
{
    xmlNodePtr next = mPimpl->mXmlNodePtr->next;
    XmlNodePtr nextHandle = nullptr;
    if (next != nullptr) {
        nextHandle = std::make_shared<XmlNode>();
        nextHandle->setXmlNode(next);
    }
    return nextHandle;
}